

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O0

QpVector * __thiscall QpVector::operator+=(QpVector *this,QpVector *other)

{
  double dVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  vector<double,_std::allocator<double>_> *this_00;
  reference pvVar4;
  int *in_RSI;
  QpVector *in_RDI;
  HighsInt i;
  int local_14;
  
  for (local_14 = 0; local_14 < *in_RSI; local_14 = local_14 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)local_14);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),(long)*pvVar2);
    dVar1 = *pvVar3;
    this_00 = &in_RDI->value;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)local_14);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*pvVar2);
    *pvVar4 = dVar1 + *pvVar4;
  }
  resparsify(in_RDI);
  return in_RDI;
}

Assistant:

QpVector& operator+=(const QpVector& other) {
    // sanitize();
    for (HighsInt i = 0; i < other.num_nz; i++) {
      // if (value[other.index[i]] == 0.0) {
      //    index[num_nz++] = other.index[i];
      // }
      value[other.index[i]] += other.value[other.index[i]];
    }
    resparsify();
    return *this;
  }